

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O1

Vec_Str_t * Gia_AigerWriteMappingSimple(Gia_Man_t *p)

{
  Vec_Int_t *pVVar1;
  char *__dest;
  Vec_Str_t *pVVar2;
  int iVar3;
  size_t __size;
  
  pVVar1 = p->vMapping;
  __size = (long)pVVar1->nSize << 2;
  __dest = (char *)malloc(__size);
  memcpy(__dest,pVVar1->pArray,__size);
  if (p->nObjs <= pVVar1->nSize) {
    iVar3 = pVVar1->nSize << 2;
    pVVar2 = (Vec_Str_t *)malloc(0x10);
    pVVar2->nSize = iVar3;
    pVVar2->nCap = iVar3;
    pVVar2->pArray = __dest;
    return pVVar2;
  }
  __assert_fail("Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                ,0xe6,"Vec_Str_t *Gia_AigerWriteMappingSimple(Gia_Man_t *)");
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(p->vMapping) );
    memcpy( pBuffer, Vec_IntArray(p->vMapping), (size_t)4*Vec_IntSize(p->vMapping) );
    assert( Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p) );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(p->vMapping) );
}